

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O1

void __thiscall Manifold_MirrorUnion2_Test::TestBody(Manifold_MirrorUnion2_Test *this)

{
  pointer *__ptr;
  char *in_R9;
  initializer_list<manifold::Manifold> __l;
  AssertionResult gtest_ar_;
  Manifold result;
  Manifold a;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  Manifold local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  AssertHelper local_88;
  string local_80;
  vector local_60 [16];
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  Manifold local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  
  local_50 = 0x3ff0000000000000;
  uStack_48 = 0x3ff0000000000000;
  local_40 = 0x3ff0000000000000;
  manifold::Manifold::Cube(local_38,0);
  local_28 = 0x3ff0000000000000;
  uStack_20 = 0;
  uStack_18 = 0;
  manifold::Manifold::Mirror(local_98,local_38);
  __l._M_len = 1;
  __l._M_array = local_98;
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)&local_80,__l,
             (allocator_type *)&local_a0);
  manifold::Manifold::Compose(local_60);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)&local_80);
  manifold::Manifold::~Manifold(local_98);
  local_98[0] = (Manifold)manifold::Manifold::MatchesTriNormals();
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98[0] == (Manifold)0x0) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_98,(AssertionResult *)"result.MatchesTriNormals()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x303,local_80._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  manifold::Manifold::~Manifold((Manifold *)local_60);
  manifold::Manifold::~Manifold(local_38);
  return;
}

Assistant:

TEST(Manifold, MirrorUnion2) {
  auto a = Manifold::Cube();
  auto result = Manifold::Compose({a.Mirror({1, 0, 0})});
  EXPECT_TRUE(result.MatchesTriNormals());
}